

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_ceq_w_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = (ulong)wd * 0x10;
  lVar3 = (ulong)ws * 0x10;
  lVar2 = (ulong)wt * 0x10;
  (env->active_fpu).fpr[wd].fs[0] =
       -(uint)((env->active_fpu).fpr[ws].fs[0] == (env->active_fpu).fpr[wt].fs[0]);
  *(uint *)((long)(env->active_fpu).fpr + lVar1 + 4) =
       -(uint)(*(int *)((long)(env->active_fpu).fpr + lVar3 + 4) ==
              *(int *)((long)(env->active_fpu).fpr + lVar2 + 4));
  *(uint *)((long)(env->active_fpu).fpr + lVar1 + 8) =
       -(uint)(*(int *)((long)(env->active_fpu).fpr + lVar3 + 8) ==
              *(int *)((long)(env->active_fpu).fpr + lVar2 + 8));
  *(uint *)((long)(env->active_fpu).fpr + lVar1 + 0xc) =
       -(uint)(*(int *)((long)(env->active_fpu).fpr + lVar3 + 0xc) ==
              *(int *)((long)(env->active_fpu).fpr + lVar2 + 0xc));
  return;
}

Assistant:

void helper_msa_ceq_w(CPUMIPSState *env, uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_ceq_w(pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_ceq_w(pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_ceq_w(pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_ceq_w(pws->w[3],  pwt->w[3]);
}